

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxy.cpp
# Opt level: O0

Clause * __thiscall Shell::EqualityProxy::apply(EqualityProxy *this,Clause *cl)

{
  EqualityProxy *pEVar1;
  bool bVar2;
  uint uVar3;
  Literal **ppLVar4;
  EqualityProxy *pEVar5;
  Clause *in_RSI;
  long in_RDI;
  Clause *res;
  Literal *rlit;
  Literal *lit;
  uint i;
  bool modified;
  RStack<Literal_*> resLits;
  uint clen;
  undefined4 in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  Inference *in_stack_ffffffffffffff10;
  Clause *this_00;
  Stack<Kernel::Literal_*> *in_stack_ffffffffffffff30;
  EqualityProxy *in_stack_ffffffffffffff38;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *in_stack_ffffffffffffff50;
  Inference *in_stack_ffffffffffffff78;
  Stack<Kernel::Literal_*> *in_stack_ffffffffffffff80;
  uint local_38;
  Clause *local_8;
  
  uVar3 = Kernel::Clause::length(in_RSI);
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
           in_stack_ffffffffffffff10);
  bVar2 = false;
  for (local_38 = 0; local_38 < uVar3; local_38 = local_38 + 1) {
    ppLVar4 = Kernel::Clause::operator[](in_RSI,local_38);
    pEVar1 = (EqualityProxy *)*ppLVar4;
    pEVar5 = (EqualityProxy *)apply(in_stack_ffffffffffffff38,(Literal *)in_stack_ffffffffffffff30);
    in_stack_ffffffffffffff38 = pEVar5;
    in_stack_ffffffffffffff30 =
         Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
         operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                     *)0xb8e9ba);
    Lib::Stack<Kernel::Literal_*>::push
              ((Stack<Kernel::Literal_*> *)in_stack_ffffffffffffff10,
               (Literal *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    if (pEVar5 != pEVar1) {
      bVar2 = true;
    }
  }
  local_8 = in_RSI;
  if (bVar2) {
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    operator*((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)0xb8ea59);
    Kernel::NonspecificInference2::NonspecificInference2
              ((NonspecificInference2 *)&stack0xffffffffffffff50,EQUALITY_PROXY_REPLACEMENT,
               &in_RSI->super_Unit,*(Unit **)(in_RDI + 0x10));
    Kernel::Inference::Inference
              (in_stack_ffffffffffffff10,
               (NonspecificInference2 *)
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    local_8 = Kernel::Clause::fromStack(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    Kernel::Inference::~Inference((Inference *)&stack0xffffffffffffff68);
    this_00 = local_8;
    Kernel::Clause::age((Clause *)0xb8eada);
    Kernel::Clause::setAge(this_00,in_stack_ffffffffffffff0c);
  }
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(in_stack_ffffffffffffff50);
  return local_8;
}

Assistant:

Clause* EqualityProxy::apply(Clause* cl)
{
  unsigned clen = cl->length();

  RStack<Literal*> resLits;

  bool modified = false;
  for (unsigned i = 0; i < clen ; i++) {
    Literal* lit=(*cl)[i];
    Literal* rlit=apply(lit);
    resLits->push(rlit);
    if (rlit != lit) {
      ASS(lit->isEquality());
      modified = true;
    }
  }
  if (!modified) {
    return cl;
  }

  ASS(_defUnit);

  auto res = Clause::fromStack(*resLits, 
    NonspecificInference2(InferenceRule::EQUALITY_PROXY_REPLACEMENT, cl, _defUnit));
  // TODO isn't this done automatically?
  res->setAge(cl->age());
  return res;
}